

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GeluLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gelu(NeuralNetworkLayer *this)

{
  GeluLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x31b) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x31b;
    this_00 = (GeluLayerParams *)operator_new(0x18);
    GeluLayerParams::GeluLayerParams(this_00);
    (this->layer_).gelu_ = this_00;
  }
  return (GeluLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GeluLayerParams* NeuralNetworkLayer::mutable_gelu() {
  if (!has_gelu()) {
    clear_layer();
    set_has_gelu();
    layer_.gelu_ = new ::CoreML::Specification::GeluLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gelu)
  return layer_.gelu_;
}